

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O1

void __thiscall
Transaction_CommitEmptyDoesNothing_Test::TestBody(Transaction_CommitEmptyDoesNothing_Test *this)

{
  element_type *peVar1;
  char *pcVar2;
  mock_mutex mutex;
  AssertionResult gtest_ar;
  database db;
  unique_lock<mock_mutex> local_180;
  AssertHelper local_170;
  undefined1 local_168 [8];
  database *local_160;
  mutex_type *local_140;
  bool local_138;
  database local_130;
  
  pstore::database::database<pstore::file::in_memory>
            (&local_130,&(this->super_Transaction).store_.file_,true);
  local_130.vacuum_mode_ = disabled;
  peVar1 = (this->super_Transaction).store_.buffer_.
           super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_180._M_device = *(mutex_type **)(peVar1 + 0x28);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_168,"pstore::leader_size","header->footer_pos.load ().absolute ()",
             &pstore::leader_size,(unsigned_long *)&local_180);
  if (local_168[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_180);
    if (local_160 == (database *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((_Alloc_hider *)&local_160->_vptr_database)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x6f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_180);
  }
  else {
    if (local_160 != (database *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_160,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160);
    }
    local_180._M_device = (mutex_type *)&local_170;
    local_180._M_owns = false;
    std::unique_lock<mock_mutex>::lock(&local_180);
    local_180._M_owns = true;
    pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
              ((transaction<std::unique_lock<mock_mutex>_> *)local_168,&local_130,&local_180);
    if ((local_180._M_owns == true) && (local_180._M_device != (mutex_type *)0x0)) {
      local_180._M_owns = false;
    }
    pstore::transaction_base::commit((transaction_base *)local_168);
    local_168 = (undefined1  [8])&PTR__transaction_00271290;
    pstore::transaction_base::rollback((transaction_base *)local_168);
    if ((local_138 == true) && (local_140 != (mutex_type *)0x0)) {
      local_138 = false;
    }
    local_180._M_device = *(mutex_type **)(peVar1 + 0x28);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_168,"pstore::leader_size","header->footer_pos.load ().absolute ()",
               &pstore::leader_size,(unsigned_long *)&local_180);
    if (local_168[0] != (internal)0x0) goto LAB_001b9408;
    testing::Message::Message((Message *)&local_180);
    if (local_160 == (database *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((_Alloc_hider *)&local_160->_vptr_database)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x77,pcVar2);
    testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_180);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_170);
  if (local_180._M_device != (mutex_type *)0x0) {
    (**(code **)(*(long *)local_180._M_device + 8))();
  }
LAB_001b9408:
  if (local_160 != (database *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_160,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160);
  }
  pstore::database::~database(&local_130);
  return;
}

Assistant:

TEST_F (Transaction, CommitEmptyDoesNothing) {
    pstore::database db{store_.file ()};
    db.set_vacuum_mode (pstore::database::vacuum_mode::disabled);

    // A quick check of the initial state.
    auto header = this->get_header ();
    ASSERT_EQ (pstore::leader_size, header->footer_pos.load ().absolute ());

    {
        mock_mutex mutex;
        auto transaction = begin (db, std::unique_lock<mock_mutex>{mutex});
        transaction.commit ();
    }

    EXPECT_EQ (pstore::leader_size, header->footer_pos.load ().absolute ());
}